

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

pair<int,_pbrt::LightBounds> * __thiscall
pbrt::BVHLightSampler::buildBVH
          (pair<int,_pbrt::LightBounds> *__return_storage_ptr__,BVHLightSampler *this,
          vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
          *bvhLights,int start,int end,uint32_t bitTrail,int depth,Allocator alloc)

{
  LightBVHNode *pLVar1;
  float fVar2;
  uint uVar3;
  LightBVHNode *pLVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar9;
  undefined4 uVar11;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined7 uVar15;
  undefined1 auVar16 [32];
  size_t sVar17;
  float fVar18;
  float fVar19;
  uint32_t uVar20;
  BVHLightSampler *pBVar21;
  int i;
  float *pfVar22;
  ulong uVar23;
  ulong uVar24;
  float fVar25;
  undefined4 in_register_0000000c;
  float *pfVar26;
  float fVar27;
  int iVar28;
  pair<int,_pbrt::LightBounds> *ppVar29;
  int iVar30;
  undefined4 in_register_00000084;
  long lVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  pointer l;
  pointer ppVar35;
  pointer ppVar36;
  LightBounds *pLVar37;
  bool bVar38;
  Float FVar39;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined1 auVar41 [56];
  undefined1 auVar40 [64];
  undefined8 uVar44;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined1 auVar45 [64];
  undefined1 auVar46 [60];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  Point3f PVar54;
  Vector3<float> VVar55;
  pair<int,_pbrt::LightBounds> child1;
  LightBounds lb;
  CompactLightBounds cb;
  Float cost [11];
  pair<int,_pbrt::LightBounds> child0;
  long local_498;
  uint32_t local_484;
  undefined1 local_480 [56];
  float local_448;
  float local_444;
  pair<int,_pbrt::LightBounds> local_440;
  pair<int,_pbrt::LightBounds> *local_3f8;
  long local_3f0;
  BVHLightSampler *local_3e8;
  pair<int,_pbrt::LightBounds> local_3e0;
  long local_3a8;
  LightBounds local_3a0;
  undefined1 local_360 [16];
  LightBounds local_344;
  float local_30c [5];
  undefined1 auStack_2f8 [16];
  undefined8 uStack_2e8;
  pair<int,_pbrt::LightBounds> local_2e0 [12];
  undefined4 uVar7;
  undefined1 auVar8 [32];
  undefined4 uVar10;
  undefined4 uVar12;
  undefined1 auVar50 [16];
  
  local_480._24_8_ = CONCAT44(in_register_00000084,end);
  local_480._32_8_ = CONCAT44(in_register_0000000c,start);
  local_2e0[0].first = start;
  local_440.first = end;
  local_484 = bitTrail;
  if (end <= start) {
    LogFatal<char_const(&)[6],char_const(&)[4],char_const(&)[6],int&,char_const(&)[4],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
               ,0x89,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [6])0x430157,
               (char (*) [4])0x2cf9491,(char (*) [6])0x430157,&local_2e0[0].first,
               (char (*) [4])0x2cf9491,&local_440.first);
  }
  local_3f8 = __return_storage_ptr__;
  if (end - start != 1) {
    auVar50._8_4_ = 0xff7fffff;
    auVar50._0_8_ = 0xff7fffffff7fffff;
    auVar50._12_4_ = 0xff7fffff;
    lVar32 = (long)start;
    local_480._40_8_ = SEXT48(end);
    local_3f0 = lVar32 * 0x38;
    lVar31 = local_3f0 + 4;
    local_3e0._0_16_ = _DAT_00446250;
    local_480._0_16_ = _DAT_00446250;
    local_3e0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar50);
    uVar42 = vmovlps_avx(auVar50);
    local_480._16_4_ = (float)uVar42;
    local_480._20_4_ = SUB84(uVar42,4);
    local_3e8 = this;
    local_3e0.second.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = lVar32;
    while( true ) {
      auVar52 = ZEXT1664(auVar50);
      auVar45 = ZEXT1664(_DAT_00446250);
      if ((long)local_480._40_8_ <= lVar32) break;
      pLVar37 = (LightBounds *)
                ((long)&((bvhLights->
                         super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->first + lVar31);
      Union<float>((Bounds3<float> *)local_2e0,(Bounds3<float> *)&local_3e0,
                   (Bounds3<float> *)pLVar37);
      auVar41 = ZEXT856((ulong)local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.
                               _4_8_);
      local_3e0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
           local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
      local_3e0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
           local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
      local_3e0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
           local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
      local_3e0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
           local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
      local_3e0.first = local_2e0[0].first;
      local_3e0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
           local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
      PVar54 = LightBounds::Centroid(pLVar37);
      local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
           PVar54.super_Tuple3<pbrt::Point3,_float>.z;
      auVar40._0_8_ = PVar54.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar40._8_56_ = auVar41;
      uVar42 = vmovlps_avx(auVar40._0_16_);
      local_440.first = (int)uVar42;
      local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
           (float)((ulong)uVar42 >> 0x20);
      Union<float>((Bounds3<float> *)local_2e0,(Bounds3<float> *)local_480,
                   (Point3<float> *)&local_440);
      auVar50._8_4_ = 0xff7fffff;
      auVar50._0_8_ = 0xff7fffffff7fffff;
      auVar50._12_4_ = 0xff7fffff;
      local_480._20_4_ = local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
      local_480._16_4_ = local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
      lVar32 = lVar32 + 1;
      lVar31 = lVar31 + 0x38;
      local_480._8_4_ = local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
      local_480._12_4_ = local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
      local_480._0_4_ = local_2e0[0].first;
      local_480._4_4_ = local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    }
    local_3e0.second._20_8_ = local_3f0 + 4;
    local_360 = SUB6416(ZEXT464(0x7f800000),0);
    fVar25 = -NAN;
    auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
    fVar27 = 0.0;
    uVar23 = 0xffffffff;
    do {
      pfVar22 = (float *)(local_480 + 0xc);
      pfVar26 = (float *)local_480;
      if (fVar27 != 0.0) {
        pfVar22 = (float *)(local_480 + 0x10);
        pfVar26 = (float *)(local_480 + 4);
        if (fVar27 != 1.4013e-45) {
          if (fVar27 == 4.2039e-45) goto LAB_0040f455;
          pfVar22 = (float *)(local_480 + 0x14);
          pfVar26 = (float *)(local_480 + 8);
        }
      }
      fVar2 = *pfVar22;
      auVar40 = ZEXT464((uint)fVar2);
      if ((fVar2 != *pfVar26) || (NAN(fVar2) || NAN(*pfVar26))) {
        lVar31 = 0x18;
        do {
          *(undefined1 (*) [16])(auStack_2f8 + lVar31) = auVar45._0_16_;
          uVar42 = vmovlps_avx(auVar52._0_16_);
          *(undefined8 *)((long)&uStack_2e8 + lVar31) = uVar42;
          *(undefined1 (*) [16])((long)&local_2e0[0].first + lVar31) = auVar53._0_16_;
          lVar31 = lVar31 + 0x34;
          lVar32 = local_3e0.second.w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          lVar34 = local_3e0.second._20_8_;
          local_480._52_4_ = (Float)uVar23;
          local_448 = fVar25;
        } while (lVar31 != 0x288);
        for (; lVar32 < (long)local_480._40_8_; lVar32 = lVar32 + 1) {
          auVar41 = ZEXT856(auVar40._8_8_);
          auVar46 = ZEXT1260(auVar45._4_12_);
          PVar54 = LightBounds::Centroid
                             ((LightBounds *)
                              ((long)&((bvhLights->
                                       super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->first + lVar34))
          ;
          auVar45._0_8_ = PVar54.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar45._8_56_ = auVar41;
          uVar42 = vmovlps_avx(auVar45._0_16_);
          local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
               PVar54.super_Tuple3<pbrt::Point3,_float>.z;
          local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar42;
          local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
               (float)(int)((ulong)uVar42 >> 0x20);
          VVar55 = Bounds3<float>::Offset((Bounds3<float> *)local_480,(Point3<float> *)&local_3a0);
          auVar53._0_4_ = VVar55.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar53._4_60_ = auVar46;
          auVar52._0_8_ = VVar55.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar52._8_56_ = auVar41;
          if (fVar27 != 0.0) {
            if (fVar27 == 1.4013e-45) {
              auVar50 = vmovshdup_avx(auVar52._0_16_);
              auVar52 = ZEXT1664(auVar50);
            }
            else {
              auVar52 = ZEXT1664(auVar53._0_16_);
            }
          }
          fVar25 = (float)(int)(auVar52._0_4_ * 12.0);
          local_440.first = (int)1.54143e-44;
          if (fVar25 != 1.68156e-44) {
            local_440.first = (int)fVar25;
          }
          local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
          if (local_440.first < 0) {
            LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],int&,char_const(&)[2],int&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                       ,0xab,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x4490f3,
                       (char (*) [2])0x28556e7,(char (*) [2])0x4490f3,&local_440.first,
                       (char (*) [2])0x28556e7,(int *)&local_344);
          }
          local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = 1.68156e-44;
          if (0xb < (uint)local_440.first) {
            LogFatal<char_const(&)[2],char_const(&)[9],char_const(&)[2],int&,char_const(&)[9],int&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                       ,0xac,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [2])0x4490f3,
                       (char (*) [9])"nBuckets",(char (*) [2])0x4490f3,&local_440.first,
                       (char (*) [9])"nBuckets",(int *)&local_344);
          }
          uVar23 = (ulong)(uint)local_440.first;
          pLVar37 = (LightBounds *)(&local_2e0[0].first + uVar23 * 0xd);
          Union((LightBounds *)&local_440,pLVar37,
                (LightBounds *)
                ((long)&((bvhLights->
                         super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->first + lVar34));
          auVar16._7_4_ = local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          auVar16._0_7_ = local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_;
          auVar16._11_4_ = local_440.second.phi;
          auVar16[0xf] = local_440.second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_;
          auVar16._16_7_ = local_440.second.w.super_Tuple3<pbrt::Vector3,_float>._1_7_;
          auVar16[0x17] = local_440.second.w.super_Tuple3<pbrt::Vector3,_float>.z._0_1_;
          auVar16._24_8_ = local_440.second._37_8_;
          auVar45 = ZEXT3264(auVar16);
          uVar9 = local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
          uVar6 = local_440.first;
          uVar10 = uVar9;
          uVar7 = uVar6;
          auVar8._4_4_ = uVar10;
          auVar8._0_4_ = uVar7;
          uVar11 = local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
          uVar12 = uVar11;
          auVar8._8_4_ = uVar12;
          uVar13 = local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
          auVar8._12_4_ = uVar13;
          uVar14 = local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x._0_1_;
          auVar8[0x10] = uVar14;
          uVar15 = local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_;
          auVar8._17_7_ = uVar15;
          auVar8._24_4_ = local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          auVar8._28_4_ = local_440.second.phi;
          auVar40 = ZEXT3264(auVar8);
          *(undefined1 (*) [32])
           ((long)&(&local_2e0[0].second)[uVar23].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x +
           1) = auVar16;
          (pLVar37->bounds).pMin = (Point3<float>)auVar8._0_12_;
          (pLVar37->bounds).pMax = (Point3<float>)auVar8._12_12_;
          pLVar37->phi = local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          (pLVar37->w).super_Tuple3<pbrt::Vector3,_float>.x = local_440.second.phi;
          lVar34 = lVar34 + 0x38;
        }
        local_498 = 0x34;
        lVar31 = 1;
        lVar32 = 0;
        while( true ) {
          auVar50 = _DAT_00446250;
          auVar51._8_4_ = 0xff7fffff;
          auVar51._0_8_ = 0xff7fffffff7fffff;
          auVar51._12_4_ = 0xff7fffff;
          auVar52 = ZEXT1664(auVar51);
          auVar45 = ZEXT1664(_DAT_00446250);
          auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar32 == 0xb) break;
          ppVar29 = local_2e0;
          local_440.first = (int)DAT_00446250;
          local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = DAT_00446250._4_4_;
          local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = DAT_00446250._8_4_;
          local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = DAT_00446250._12_4_;
          uVar42 = vmovlps_avx(auVar51);
          local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x._0_1_ =
               (undefined1)uVar42;
          local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_ =
               SUB87((ulong)uVar42 >> 8,0);
          local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)_DAT_00446250;
          local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)_UNK_00446254;
          local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = (float)_UNK_00446258;
          local_3a0.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)_UNK_0044625c;
          uVar42 = vmovlps_avx(auVar51);
          local_3a0.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar42;
          local_3a0.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)((ulong)uVar42 >> 0x20)
          ;
          local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
          local_440.second.phi = 0.0;
          local_440.second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = 0;
          local_440.second.w.super_Tuple3<pbrt::Vector3,_float>._1_7_ = 0;
          local_3a0.w.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
          local_3a0.w.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
          _DAT_00446250 = auVar50;
          local_3e0.second._44_8_ = lVar32;
          local_3a8 = lVar31;
          local_3a0.phi = local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
          local_3a0.w.super_Tuple3<pbrt::Vector3,_float>.x = local_440.second.phi;
          while (bVar38 = lVar31 != 0, lVar31 = lVar31 + -1, lVar32 = local_498, bVar38) {
            Union(&local_344,(LightBounds *)&local_440,(LightBounds *)ppVar29);
            local_440.second._37_8_ = local_344._41_8_;
            ppVar29 = (pair<int,_pbrt::LightBounds> *)&(ppVar29->second).twoSided;
            local_440.second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ =
                 local_344.w.super_Tuple3<pbrt::Vector3,_float>.y._0_1_;
            local_440.second.w.super_Tuple3<pbrt::Vector3,_float>._1_7_ =
                 local_344.w.super_Tuple3<pbrt::Vector3,_float>._5_7_;
            local_440.second.w.super_Tuple3<pbrt::Vector3,_float>.z._0_1_ =
                 local_344.cosTheta_o._0_1_;
            local_440.first = (int)local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x._0_1_ =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y._0_1_;
            local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_ =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._5_7_;
            local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                 (float)CONCAT71(local_344._25_7_,local_344.phi._0_1_);
            local_440.second.phi = local_344.w.super_Tuple3<pbrt::Vector3,_float>.x;
          }
          for (; uVar42 = local_3e0.second._44_8_, pBVar21 = local_3e8, lVar32 != 0x270;
              lVar32 = lVar32 + 0x34) {
            Union(&local_344,&local_3a0,(LightBounds *)((long)&local_2e0[0].first + lVar32));
            local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            local_3a0.w.super_Tuple3<pbrt::Vector3,_float>.y =
                 (float)CONCAT31(local_344.w.super_Tuple3<pbrt::Vector3,_float>.y._1_3_,
                                 local_344.w.super_Tuple3<pbrt::Vector3,_float>.y._0_1_);
            local_3a0.w.super_Tuple3<pbrt::Vector3,_float>.z =
                 local_344.w.super_Tuple3<pbrt::Vector3,_float>.z;
            local_3a0.cosTheta_o._0_1_ = local_344.cosTheta_o._0_1_;
            local_3a0.cosTheta_o._1_3_ = local_344.cosTheta_o._1_3_;
            local_3a0._44_5_ = local_344._44_5_;
            local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            local_3a0.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            local_3a0.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
                 (float)CONCAT71(local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._5_7_,
                                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y._0_1_);
            local_3a0.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            local_3a0.phi = (Float)CONCAT71(local_344._25_7_,local_344.phi._0_1_);
            local_3a0.w.super_Tuple3<pbrt::Vector3,_float>.x =
                 local_344.w.super_Tuple3<pbrt::Vector3,_float>.x;
          }
          local_3e0.second._36_8_ = local_3e0.second._44_8_ + 1;
          local_444 = EvaluateCost(local_3e8,(LightBounds *)&local_440,(Bounds3f *)&local_3e0,
                                   (int)fVar27);
          FVar39 = EvaluateCost(pBVar21,&local_3a0,(Bounds3f *)&local_3e0,(int)fVar27);
          local_498 = local_498 + 0x34;
          lVar31 = local_3a8 + 1;
          local_30c[uVar42 + -1] = FVar39 + local_444;
          lVar32 = local_3e0.second._36_8_;
        }
        uVar23 = (ulong)(uint)local_480._52_4_;
        fVar25 = local_448;
        for (uVar24 = 1; uVar24 != 0xb; uVar24 = uVar24 + 1) {
          fVar2 = local_30c[uVar24 - 1];
          uVar42 = vcmpps_avx512vl(ZEXT416((uint)fVar2),ZEXT816(0),0xe);
          uVar44 = vcmpps_avx512vl(ZEXT416((uint)fVar2),local_360,1);
          bVar38 = (bool)((byte)uVar42 & (byte)uVar44 & 1);
          if (bVar38 != false) {
            uVar23 = uVar24 & 0xffffffff;
            fVar25 = fVar27;
          }
          local_360._0_4_ = (uint)bVar38 * (int)fVar2 + (uint)!bVar38 * local_360._0_4_;
        }
      }
      fVar27 = (float)((int)fVar27 + 1);
    } while( true );
  }
  sVar17 = (this->nodes).nStored;
  CompactLightBounds::CompactLightBounds
            ((CompactLightBounds *)&local_440,
             &(bvhLights->
              super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
              )._M_impl.super__Vector_impl_data._M_start[start].second,&this->allLightBounds);
  local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
       local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  local_2e0[0].first = local_440.first;
  uVar3 = (bvhLights->
          super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
          )._M_impl.super__Vector_impl_data._M_start[start].first;
  local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
       (float)CONCAT71(local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_,
                       local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x._0_1_);
  local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
       local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
  local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)(uVar3 | 0x80000000);
  pstd::vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>::push_back
            (&this->nodes,(LightBVHNode *)local_2e0);
  HashMap<pbrt::LightHandle,_unsigned_int,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
  ::Insert(&this->lightToBitTrail,(this->lights).ptr + (int)uVar3,&local_484);
  ppVar36 = (bvhLights->
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_3f8->first = (int)sVar17;
  pLVar37 = &ppVar36[start].second;
  local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ =
       *(undefined8 *)&(pLVar37->bounds).pMin;
  local_3a0.bounds._8_8_ = *(undefined8 *)((long)&(pLVar37->bounds).pMin + 8);
  uVar42 = *(undefined8 *)((long)&(pLVar37->bounds).pMax + 4);
  uVar43._0_4_ = pLVar37->phi;
  uVar43._4_4_ = (pLVar37->w).super_Tuple3<pbrt::Vector3,_float>.x;
  pfVar26 = (float *)((long)&ppVar36[start].second.bounds.pMax + 8);
  uVar44 = *(undefined8 *)pfVar26;
  uVar47 = *(undefined8 *)(pfVar26 + 2);
  uVar48 = *(undefined8 *)(pfVar26 + 4);
  uVar49 = *(undefined8 *)(pfVar26 + 6);
LAB_0040f6f5:
  (local_3f8->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
       local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  (local_3f8->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
       local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  *(undefined8 *)&(local_3f8->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
       local_3a0.bounds._8_8_;
  (local_3f8->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar42;
  (local_3f8->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar42 >> 0x20);
  (local_3f8->second).phi = (Float)(int)uVar43;
  (local_3f8->second).w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)uVar43 >> 0x20);
  *(undefined8 *)&(local_3f8->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar44;
  (local_3f8->second).w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar47;
  (local_3f8->second).w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar47 >> 0x20);
  *(undefined8 *)&(local_3f8->second).w.super_Tuple3<pbrt::Vector3,_float>.z = uVar48;
  (local_3f8->second).cosTheta_e = (Float)(int)uVar49;
  (local_3f8->second).twoSided = (bool)(char)((ulong)uVar49 >> 0x20);
  *(int3 *)&(local_3f8->second).field_0x31 = (int3)((ulong)uVar49 >> 0x28);
  return local_3f8;
LAB_0040f455:
  if (fVar25 == -NAN) {
    iVar33 = ((int)local_480._24_8_ + (int)local_480._32_8_) / 2;
  }
  else {
    ppVar36 = (bvhLights->
              super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x._0_1_ =
         (undefined1)local_480._16_8_;
    local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_ = SUB87(local_480._16_8_,1)
    ;
    l = ppVar36 + local_480._40_8_;
    local_440.first = local_480._0_4_;
    local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = local_480._4_4_;
    local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = local_480._8_4_;
    local_440.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = local_480._12_4_;
    ppVar29 = (pair<int,_pbrt::LightBounds> *)((long)&ppVar36->first + local_3f0);
    local_440.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar25;
    local_440.second.phi = (Float)uVar23;
    while (ppVar36 = l, ppVar29 != l) {
      bVar38 = buildBVH::anon_class_32_3_7db0f350::operator()
                         ((anon_class_32_3_7db0f350 *)&local_440,ppVar29);
      if (bVar38) {
        ppVar29 = ppVar29 + 1;
      }
      else {
        do {
          ppVar35 = l;
          l = ppVar35 + -1;
          ppVar36 = ppVar29;
          if (l == ppVar29) goto LAB_0040f55d;
          bVar38 = buildBVH::anon_class_32_3_7db0f350::operator()
                             ((anon_class_32_3_7db0f350 *)&local_440,l);
        } while (!bVar38);
        iVar33 = ppVar29->first;
        ppVar29->first = l->first;
        l->first = iVar33;
        local_2e0[0].first = (int)(ppVar29->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
             (ppVar29->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_ =
             *(undefined8 *)&(ppVar29->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        uVar42._0_4_ = (ppVar29->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        uVar42._4_4_ = (ppVar29->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        uVar44._0_4_ = (ppVar29->second).phi;
        uVar44._4_4_ = (ppVar29->second).w.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar5 = (ppVar29->second).w.super_Tuple3<pbrt::Vector3,_float>.y;
        uVar43 = *(undefined8 *)&(ppVar29->second).w.super_Tuple3<pbrt::Vector3,_float>.z;
        uVar47._0_4_ = (ppVar29->second).cosTheta_e;
        uVar47._4_1_ = (ppVar29->second).twoSided;
        uVar47._5_3_ = *(undefined3 *)&(ppVar29->second).field_0x31;
        local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>._4_5_ = (undefined5)uVar43;
        local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.z._1_3_ =
             (undefined3)((ulong)uVar43 >> 0x28);
        local_2e0[0].second._40_5_ = (undefined5)uVar47;
        fVar25 = ppVar35[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        fVar27 = ppVar35[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
        uVar43 = *(undefined8 *)&ppVar35[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
        fVar2 = ppVar35[-1].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
        fVar18 = ppVar35[-1].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
        FVar39 = ppVar35[-1].second.phi;
        fVar19 = ppVar35[-1].second.w.super_Tuple3<pbrt::Vector3,_float>.x;
        *(undefined1 (*) [32])
         ((long)&(ppVar29->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y + 1) =
             *(undefined1 (*) [32])
              ((long)&ppVar35[-1].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y + 1);
        (ppVar29->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = fVar25;
        (ppVar29->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar27;
        *(undefined8 *)&(ppVar29->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar43;
        (ppVar29->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = fVar2;
        (ppVar29->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar18;
        (ppVar29->second).phi = FVar39;
        (ppVar29->second).w.super_Tuple3<pbrt::Vector3,_float>.x = fVar19;
        local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_ =
             (undefined1)(undefined4)uVar44;
        local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = (undefined1)uVar5;
        local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._1_3_ =
             (undefined3)((uint)uVar5 >> 8);
        *(ulong *)((long)&ppVar35[-1].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y + 1) =
             CONCAT17(local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_,
                      (int7)((ulong)uVar42 >> 8));
        *(ulong *)((long)&ppVar35[-1].second.phi + 1) =
             CONCAT17(local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_,
                      (int7)((ulong)uVar44 >> 8));
        *(ulong *)((long)&ppVar35[-1].second.w.super_Tuple3<pbrt::Vector3,_float>.y + 1) =
             CONCAT53(local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>._4_5_,
                      local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._1_3_);
        *(ulong *)((long)&ppVar35[-1].second.cosTheta_o + 1) =
             CONCAT53(local_2e0[0].second._40_5_,
                      local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.z._1_3_);
        ppVar35[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
             (float)local_2e0[0].first;
        ppVar35[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
        *(undefined8 *)&ppVar35[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
             local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_;
        ppVar35[-1].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
             (float)(undefined4)uVar42;
        ppVar35[-1].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar42._4_4_;
        ppVar35[-1].second.phi = (Float)(undefined4)uVar44;
        ppVar35[-1].second.w.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar44._4_4_;
        ppVar29 = ppVar29 + 1;
        local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
             (float)(undefined4)uVar42;
        local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar42._4_4_;
        local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
             (float)(undefined4)uVar44;
        local_2e0[0].second.phi = (Float)uVar44._4_4_;
        local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar5;
        local_2e0[0].second.cosTheta_e._1_3_ = uVar47._5_3_;
      }
    }
LAB_0040f55d:
    iVar33 = (int)(((long)ppVar36 -
                   (long)(bvhLights->
                         super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x38);
    iVar30 = (int)local_480._32_8_;
    iVar28 = (int)local_480._24_8_;
    if (iVar33 == iVar30 || iVar33 == iVar28) {
      iVar33 = (iVar28 + iVar30) / 2;
    }
    if ((iVar33 <= iVar30) || (iVar28 <= iVar33)) {
      LogFatal<char_const(&)[25]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                 ,0xdb,"Check failed: %s",(char (*) [25])"mid > start && mid < end");
    }
  }
  pBVar21 = local_3e8;
  sVar17 = (local_3e8->nodes).nStored;
  local_2e0[0].first = 0;
  local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_2e0[0].second.phi = 0.0;
  pstd::vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>::push_back
            (&local_3e8->nodes,(LightBVHNode *)local_2e0);
  uVar20 = local_484;
  local_440.first = 0x40;
  local_2e0[0].first = depth;
  if (0x3f < depth) {
    LogFatal<char_const(&)[6],char_const(&)[3],char_const(&)[6],int&,char_const(&)[3],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
               ,0xe1,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [6])0x446121,
               (char (*) [3])0x44b030,(char (*) [6])0x446121,&local_2e0[0].first,
               (char (*) [3])0x44b030,&local_440.first);
  }
  buildBVH(local_2e0,pBVar21,bvhLights,(int)local_480._32_8_,iVar33,local_484,depth + 1,alloc);
  iVar28 = (int)sVar17;
  local_440.first = iVar28 + 1;
  local_3a0.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)local_2e0[0].first;
  if (local_440.first != local_2e0[0].first) {
    LogFatal<char_const(&)[14],char_const(&)[13],char_const(&)[14],int&,char_const(&)[13],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
               ,0xe4,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [14])"nodeIndex + 1",
               (char (*) [13])"child0.first",(char (*) [14])"nodeIndex + 1",&local_440.first,
               (char (*) [13])"child0.first",(int *)&local_3a0);
  }
  buildBVH(&local_440,pBVar21,bvhLights,iVar33,(int)local_480._24_8_,uVar20 | 1 << (depth & 0x1fU),
           depth + 1,alloc);
  Union(&local_3a0,&local_2e0[0].second,&local_440.second);
  CompactLightBounds::CompactLightBounds
            ((CompactLightBounds *)&local_344,&local_3a0,&pBVar21->allLightBounds);
  pLVar4 = (pBVar21->nodes).ptr;
  *(ulong *)(pLVar4[iVar28].lightBounds.qb[0] + 2) =
       CONCAT71(local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._5_7_,
                local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y._0_1_);
  pLVar1 = pLVar4 + iVar28;
  (pLVar1->lightBounds).w =
       (OctahedralVector)local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  (pLVar1->lightBounds).phi = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  *(undefined8 *)&(pLVar1->lightBounds).field_2 = local_344.bounds._8_8_;
  pLVar4[iVar28].field_1 =
       (anon_struct_4_2_cf919bac_for_LightBVHNode_1)(local_440.first & 0x7fffffff);
  uVar42 = CONCAT44(local_3a0.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z,
                    local_3a0.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y);
  uVar43 = CONCAT44(local_3a0.w.super_Tuple3<pbrt::Vector3,_float>.x,local_3a0.phi);
  uVar44 = CONCAT44(local_3a0.phi,local_3a0.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z);
  uVar47 = CONCAT44(local_3a0.w.super_Tuple3<pbrt::Vector3,_float>.y,
                    local_3a0.w.super_Tuple3<pbrt::Vector3,_float>.x);
  uVar48 = CONCAT44(local_3a0.cosTheta_o,local_3a0.w.super_Tuple3<pbrt::Vector3,_float>.z);
  uVar49 = CONCAT35(local_3a0._49_3_,local_3a0._44_5_);
  local_3f8->first = iVar28;
  goto LAB_0040f6f5;
}

Assistant:

std::pair<int, LightBounds> BVHLightSampler::buildBVH(
    std::vector<std::pair<int, LightBounds>> &bvhLights, int start, int end,
    uint32_t bitTrail, int depth, Allocator alloc) {
    CHECK_LT(start, end);
    // Initialize leaf node if only a single light remains
    if (end - start == 1) {
        int nodeIndex = nodes.size();
        CompactLightBounds cb(bvhLights[start].second, allLightBounds);
        int lightIndex = bvhLights[start].first;
        nodes.push_back(LightBVHNode::MakeLeaf(lightIndex, cb));
        lightToBitTrail.Insert(lights[lightIndex], bitTrail);
        return {nodeIndex, bvhLights[start].second};
    }

    // Choose split dimension and position using modified SAH
    // Compute bounds and centroid bounds for lights
    Bounds3f bounds, centroidBounds;
    for (int i = start; i < end; ++i) {
        const LightBounds &lb = bvhLights[i].second;
        bounds = Union(bounds, lb.bounds);
        centroidBounds = Union(centroidBounds, lb.Centroid());
    }

    Float minCost = Infinity;
    int minCostSplitBucket = -1, minCostSplitDim = -1;
    constexpr int nBuckets = 12;
    for (int dim = 0; dim < 3; ++dim) {
        // Compute minimum cost bucket for splitting along dimension _dim_
        if (centroidBounds.pMax[dim] == centroidBounds.pMin[dim])
            continue;
        // Compute _LightBounds_ for each bucket
        LightBounds bucketLightBounds[nBuckets];
        for (int i = start; i < end; ++i) {
            Point3f pc = bvhLights[i].second.Centroid();
            int b = nBuckets * centroidBounds.Offset(pc)[dim];
            if (b == nBuckets)
                b = nBuckets - 1;
            CHECK_GE(b, 0);
            CHECK_LT(b, nBuckets);
            bucketLightBounds[b] = Union(bucketLightBounds[b], bvhLights[i].second);
        }

        // Compute costs for splitting lights after each bucket
        Float cost[nBuckets - 1];
        for (int i = 0; i < nBuckets - 1; ++i) {
            // Find _LightBounds_ for lights below and above bucket split
            LightBounds b0, b1;
            for (int j = 0; j <= i; ++j)
                b0 = Union(b0, bucketLightBounds[j]);
            for (int j = i + 1; j < nBuckets; ++j)
                b1 = Union(b1, bucketLightBounds[j]);

            // Compute final light split cost for bucket
            cost[i] = EvaluateCost(b0, bounds, dim) + EvaluateCost(b1, bounds, dim);
        }

        // Find light split that minimizes SAH metric
        for (int i = 1; i < nBuckets - 1; ++i) {
            if (cost[i] > 0 && cost[i] < minCost) {
                minCost = cost[i];
                minCostSplitBucket = i;
                minCostSplitDim = dim;
            }
        }
    }

    // Partition lights according to chosen split
    int mid;
    if (minCostSplitDim == -1) {
        mid = (start + end) / 2;
    } else {
        const auto *pmid = std::partition(
            &bvhLights[start], &bvhLights[end - 1] + 1,
            [=](const std::pair<int, LightBounds> &l) {
                int b = nBuckets *
                        centroidBounds.Offset(l.second.Centroid())[minCostSplitDim];
                if (b == nBuckets)
                    b = nBuckets - 1;
                CHECK_GE(b, 0);
                CHECK_LT(b, nBuckets);
                return b <= minCostSplitBucket;
            });
        mid = pmid - &bvhLights[0];
        if (mid == start || mid == end)
            mid = (start + end) / 2;
        CHECK(mid > start && mid < end);
    }

    // Allocate interior _LightBVHNode_ and recursively initialize children
    int nodeIndex = nodes.size();
    nodes.push_back(LightBVHNode());
    CHECK_LT(depth, 64);
    std::pair<int, LightBounds> child0 =
        buildBVH(bvhLights, start, mid, bitTrail, depth + 1, alloc);
    CHECK_EQ(nodeIndex + 1, child0.first);
    std::pair<int, LightBounds> child1 =
        buildBVH(bvhLights, mid, end, bitTrail | (1u << depth), depth + 1, alloc);

    // Initialize interior node and return node index and bounds
    LightBounds lb = Union(child0.second, child1.second);
    CompactLightBounds cb(lb, allLightBounds);
    nodes[nodeIndex] = LightBVHNode::MakeInterior(child1.first, cb);
    return {nodeIndex, lb};
}